

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall httplib::Server::routing(Server *this,Request *req,Response *res)

{
  string *psVar1;
  pointer ppVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  pointer __re;
  
  psVar1 = &req->method;
  iVar6 = std::__cxx11::string::compare((char *)psVar1);
  if ((iVar6 == 0) && (bVar4 = handle_file_request(this,req,res), bVar4)) {
    return true;
  }
  iVar6 = std::__cxx11::string::compare((char *)psVar1);
  if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)psVar1), iVar6 == 0)) {
    __re = (this->get_handlers_).
           super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (this->get_handlers_).
             super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__re == ppVar2) {
      return __re != ppVar2;
    }
    _Var3._M_current = (req->path)._M_dataplus._M_p;
    bVar5 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                      (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(_Var3._M_current + (req->path)._M_string_length),&req->matches,
                       &__re->first,0);
    bVar4 = true;
    while (bVar5 == false) {
      __re = __re + 1;
      bVar4 = __re != ppVar2;
      if (__re == ppVar2) {
        return bVar4;
      }
      _Var3._M_current = (req->path)._M_dataplus._M_p;
      bVar5 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(_Var3._M_current + (req->path)._M_string_length),&req->matches,
                         &__re->first,0);
    }
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar6 == 0) {
      __re = (this->post_handlers_).
             super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (this->post_handlers_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__re == ppVar2) {
        return __re != ppVar2;
      }
      _Var3._M_current = (req->path)._M_dataplus._M_p;
      bVar5 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(_Var3._M_current + (req->path)._M_string_length),&req->matches,
                         &__re->first,0);
      bVar4 = true;
      while (bVar5 == false) {
        __re = __re + 1;
        bVar4 = __re != ppVar2;
        if (__re == ppVar2) {
          return bVar4;
        }
        _Var3._M_current = (req->path)._M_dataplus._M_p;
        bVar5 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )(_Var3._M_current + (req->path)._M_string_length),&req->matches,
                           &__re->first,0);
      }
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar6 == 0) {
        __re = (this->put_handlers_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        ppVar2 = (this->put_handlers_).
                 super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (__re == ppVar2) {
          return __re != ppVar2;
        }
        _Var3._M_current = (req->path)._M_dataplus._M_p;
        bVar5 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )(_Var3._M_current + (req->path)._M_string_length),&req->matches,
                           &__re->first,0);
        bVar4 = true;
        while (bVar5 == false) {
          __re = __re + 1;
          bVar4 = __re != ppVar2;
          if (__re == ppVar2) {
            return bVar4;
          }
          _Var3._M_current = (req->path)._M_dataplus._M_p;
          bVar5 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(_Var3._M_current + (req->path)._M_string_length),&req->matches
                             ,&__re->first,0);
        }
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar6 != 0) {
          iVar6 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar6 != 0) {
            return false;
          }
          bVar4 = dispatch_request(this,req,res,&this->options_handlers_);
          return bVar4;
        }
        __re = (this->delete_handlers_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        ppVar2 = (this->delete_handlers_).
                 super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (__re == ppVar2) {
          return __re != ppVar2;
        }
        _Var3._M_current = (req->path)._M_dataplus._M_p;
        bVar5 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )(_Var3._M_current + (req->path)._M_string_length),&req->matches,
                           &__re->first,0);
        bVar4 = true;
        while (bVar5 == false) {
          __re = __re + 1;
          bVar4 = __re != ppVar2;
          if (__re == ppVar2) {
            return bVar4;
          }
          _Var3._M_current = (req->path)._M_dataplus._M_p;
          bVar5 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(_Var3._M_current + (req->path)._M_string_length),&req->matches
                             ,&__re->first,0);
        }
      }
    }
  }
  if ((__re->second).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(__re->second)._M_invoker)((_Any_data *)&__re->second,req,res);
    return bVar4;
  }
  std::__throw_bad_function_call();
}

Assistant:

inline bool Server::routing(Request& req, Response& res)
{
    if (req.method == "GET" && handle_file_request(req, res)) {
        return true;
    }

    if (req.method == "GET" || req.method == "HEAD") {
        return dispatch_request(req, res, get_handlers_);
    } else if (req.method == "POST") {
        return dispatch_request(req, res, post_handlers_);
    } else if (req.method == "PUT") {
        return dispatch_request(req, res, put_handlers_);
    } else if (req.method == "DELETE") {
        return dispatch_request(req, res, delete_handlers_);
    } else if (req.method == "OPTIONS") {
        return dispatch_request(req, res, options_handlers_);
    }
    return false;
}